

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::FormatToVulgarFraction
          (ON_wString *this,int numerator,int denominator,bool bReduced,bool bProper,
          uint proper_fraction_separator_cp,bool bUseVulgarFractionCodePoints)

{
  uint uVar1;
  int iVar2;
  ON_wString OVar3;
  uint uVar4;
  ON_wString local_d8;
  byte local_c9;
  ON_wString local_c8;
  ON_wString local_c0;
  ON_wString local_b8;
  ON_wString local_b0;
  ON_wString local_a8;
  ON_wString vulgar_fraction;
  ON_wString fraction;
  uint cp_count;
  uint cp [3];
  uint fraction_cp;
  int n;
  int gcd;
  ON_wString local_50 [3];
  ON_wString local_38;
  ON_wString local_30;
  byte local_21;
  ON__UINT32 local_20;
  byte local_1a;
  bool bUseVulgarFractionCodePoints_local;
  uint proper_fraction_separator_cp_local;
  bool bProper_local;
  uint uStack_14;
  bool bReduced_local;
  int denominator_local;
  int numerator_local;
  
  local_21 = bUseVulgarFractionCodePoints;
  uStack_14 = numerator;
  local_20 = proper_fraction_separator_cp;
  local_1a = bProper;
  bUseVulgarFractionCodePoints_local = bReduced;
  proper_fraction_separator_cp_local = denominator;
  _denominator_local = this;
  if (denominator == 0) {
    FormatToString((wchar_t *)&local_30,L"%d",(ulong)(uint)numerator);
    ON_wString(&local_38,L"0");
    FormatToVulgarFraction(this,&local_30,&local_38);
    ~ON_wString(&local_38);
    ~ON_wString(&local_30);
  }
  else if (numerator == 0) {
    if (bReduced) {
      ON_wString(this,L"0");
    }
    else {
      ON_wString(local_50,L"0");
      FormatToString(&n,L"%d",(ulong)proper_fraction_separator_cp_local);
      FormatToVulgarFraction(this,local_50,(ON_wString *)&n);
      ~ON_wString((ON_wString *)&n);
      ~ON_wString(local_50);
    }
  }
  else {
    if (((bReduced) || (bProper)) && (denominator < 0)) {
      proper_fraction_separator_cp_local = -denominator;
      uStack_14 = -numerator;
    }
    if (bReduced) {
      uVar1 = uStack_14;
      if ((int)uStack_14 < 1) {
        uVar1 = -uStack_14;
      }
      if (1 < (int)uVar1) {
        uVar1 = proper_fraction_separator_cp_local;
        if ((int)proper_fraction_separator_cp_local < 1) {
          uVar1 = -proper_fraction_separator_cp_local;
        }
        if (1 < (int)uVar1) {
          uVar1 = uStack_14;
          if ((int)uStack_14 < 1) {
            uVar1 = -uStack_14;
          }
          uVar1 = ON_GreatestCommonDivisor(uVar1,proper_fraction_separator_cp_local);
          if (0 < (int)uVar1) {
            uStack_14 = (int)uStack_14 / (int)uVar1;
            proper_fraction_separator_cp_local =
                 (int)proper_fraction_separator_cp_local / (int)uVar1;
          }
        }
      }
    }
    cp[2] = 0;
    if ((local_1a & 1) != 0) {
      uVar1 = uStack_14;
      if ((int)uStack_14 < 1) {
        uVar1 = -uStack_14;
      }
      if ((int)proper_fraction_separator_cp_local <= (int)uVar1) {
        cp[2] = (int)uStack_14 / (int)proper_fraction_separator_cp_local;
        uStack_14 = uStack_14 - cp[2] * proper_fraction_separator_cp_local;
        if ((int)uStack_14 < 1) {
          uStack_14 = -uStack_14;
        }
        if (uStack_14 == 0) {
          FormatToString((wchar_t *)this,L"%d",(ulong)cp[2]);
          return (ON_wString)(wchar_t *)this;
        }
        if ((local_20 != 0) && (iVar2 = ON_IsValidUnicodeCodePoint(local_20), iVar2 == 0)) {
          local_20 = 0;
        }
      }
    }
    if ((local_21 & 1) != 0) {
      uVar1 = uStack_14;
      if ((int)uStack_14 < 1) {
        uVar1 = -uStack_14;
      }
      uVar4 = proper_fraction_separator_cp_local;
      if ((int)proper_fraction_separator_cp_local < 1) {
        uVar4 = -proper_fraction_separator_cp_local;
      }
      if (((int)uVar1 < (int)uVar4) &&
         (proper_fraction_separator_cp_local - 2 < 8 || proper_fraction_separator_cp_local == 10)) {
        OVar3.m_s = (wchar_t *)
                    (*(code *)(&DAT_00a26a4c +
                              *(int *)(&DAT_00a26a4c +
                                      (ulong)(proper_fraction_separator_cp_local - 2) * 4)))();
        return (ON_wString)OVar3.m_s;
      }
    }
    FormatToString((wchar_t *)&local_b0,L"%d",(ulong)uStack_14);
    FormatToString((wchar_t *)&local_b8,L"%d",(ulong)proper_fraction_separator_cp_local);
    FormatToVulgarFraction(&local_a8,&local_b0,&local_b8);
    ~ON_wString(&local_b8);
    ~ON_wString(&local_b0);
    local_c9 = 0;
    if (cp[2] == 0) {
      ON_wString(this,&local_a8);
    }
    else {
      FormatToString((wchar_t *)&local_c8,L"%d",(ulong)cp[2]);
      local_c9 = 1;
      FromUnicodeCodePoint(&local_d8,local_20);
      operator+(&local_c0,&local_c8);
      operator+(this,&local_c0);
      ~ON_wString(&local_c0);
      ~ON_wString(&local_d8);
    }
    if ((local_c9 & 1) != 0) {
      ~ON_wString(&local_c8);
    }
    ~ON_wString(&local_a8);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FormatToVulgarFraction(
  int numerator,
  int denominator,
  bool bReduced,
  bool bProper,
  unsigned proper_fraction_separator_cp,
  bool bUseVulgarFractionCodePoints
)
{
  if (0 == denominator)
  {
    // ... Kids these days!
    return ON_wString::FormatToVulgarFraction(ON_wString::FormatToString(L"%d", numerator), L"0");
  }

  if (0 == numerator)
  {
    if (bReduced)
      return ON_wString(L"0");
    if (bUseVulgarFractionCodePoints && 3 == numerator)
      return ON_wString((wchar_t)0x2189); // Baseball zero for three 0/3 = U+2189

    return ON_wString::FormatToVulgarFraction(L"0", ON_wString::FormatToString(L"%d", denominator));
  }

  if (bReduced || bProper)
  {
    if (denominator < 0)
    {
      denominator = -denominator;
      numerator = -numerator;
    }
  }

  if (bReduced && abs(numerator) > 1 && abs(denominator) > 1)
  {
    const int gcd = (int)ON_GreatestCommonDivisor((unsigned)(abs(numerator)), (unsigned)denominator);
    if (gcd > 0)
    {
      numerator /= gcd;
      denominator /= gcd;
    }
  }

  int n = 0;
  if (bProper && abs(numerator) >= denominator)
  {
    n = numerator / denominator;
    numerator = abs(numerator - (n * denominator));
    if (0 == numerator)
      return ON_wString::FormatToString(L"%d", n);

    if (0 != proper_fraction_separator_cp && false == ON_IsValidUnicodeCodePoint(proper_fraction_separator_cp))
      proper_fraction_separator_cp = 0;
  }

  if (bUseVulgarFractionCodePoints && abs(numerator) < abs(denominator))
  {
    unsigned fraction_cp = 0;
    switch (denominator)
    {
    case 2:
      if (1 == numerator)
        fraction_cp = 0x00BD;
      break;
    case 3:
      if (1 == numerator)
        fraction_cp = 0x2153;
      else if (2 == numerator)
        fraction_cp = 0x2154;
      break;
    case 4:
      if (1 == numerator)
        fraction_cp = 0x00BC;
      else if (3 == numerator)
        fraction_cp = 0x00BE;
      break;
    case 5:
      if (1 == numerator)
        fraction_cp = 0x2155;
      else if (2 == numerator)
        fraction_cp = 0x2156;
      else if (3 == numerator)
        fraction_cp = 0x2157;
      else if (4 == numerator)
        fraction_cp = 0x2158;
      break;
    case 6:
      if (1 == numerator)
        fraction_cp = 0x2159;
      else if (5 == numerator)
        fraction_cp = 0x215A;
      break;
    case 7:
      if (1 == numerator)
        fraction_cp = 0x2150;
      break;
    case 8:
      if (1 == numerator)
        fraction_cp = 0x215B;
      else if (3 == numerator)
        fraction_cp = 0x215C;
      else if (5 == numerator)
        fraction_cp = 0x215D;
      else if (7 == numerator)
        fraction_cp = 0x215E;
      break;
    case 9:
      if (1 == numerator)
        fraction_cp = 0x2151;
      break;
    case 10:
      if (1 == numerator)
        fraction_cp = 0x2152;
      break;
    }

    if (fraction_cp > 0 && ON_IsValidUnicodeCodePoint(fraction_cp))
    {
      unsigned cp[3] = {};
      unsigned cp_count = 0;
      if (0 == n && numerator < 0)
        cp[cp_count++] = ON_UnicodeCodePoint::ON_HyphenMinus;
      cp[cp_count++] = fraction_cp;
      const ON_wString fraction = ON_wString::FromUnicodeCodePoints(cp, cp_count, ON_UnicodeCodePoint::ON_ReplacementCharacter);
      if (0 == n)
        return fraction;
      return ON_wString::FormatToString(L"%d", n)
        + ON_wString::FromUnicodeCodePoint(proper_fraction_separator_cp)
        + fraction;
    }
  }

  const ON_wString vulgar_fraction = ON_wString::FormatToVulgarFraction(ON_wString::FormatToString(L"%d", numerator), ON_wString::FormatToString(L"%d", denominator));
  return
    (0 == n)
    ? vulgar_fraction
    : ON_wString::FormatToString(L"%d", n) + ON_wString::FromUnicodeCodePoint(proper_fraction_separator_cp) + vulgar_fraction;
}